

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::NullColumnReader::Plain
          (NullColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  ulong *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  idx_t idx_in_entry;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  if (num_values != 0) {
    do {
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_48,&local_38);
        p_Var4 = p_Stack_40;
        peVar3 = local_48;
        local_48 = (element_type *)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar3;
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
        }
        pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)
             (pTVar5->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
      }
      bVar2 = (byte)result_offset & 0x3f;
      puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
               (result_offset >> 6);
      *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      result_offset = result_offset + 1;
      num_values = num_values - 1;
    } while (num_values != 0);
  }
  return;
}

Assistant:

void Plain(ByteBuffer &plain_data, uint8_t *defines, uint64_t num_values, idx_t result_offset,
	           Vector &result) override {
		(void)defines;
		(void)plain_data;

		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = 0; row_idx < num_values; row_idx++) {
			result_mask.SetInvalid(row_idx + result_offset);
		}
	}